

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O1

void __thiscall
duckdb::Relation::WriteCSV
          (Relation *this,string *csv_file,case_insensitive_map_t<vector<Value>_> *options)

{
  pointer pQVar1;
  long *plVar2;
  element_type *peVar3;
  pointer *__ptr;
  unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> res;
  shared_ptr<duckdb::Relation,_true> write_csv;
  string prepended_message;
  undefined1 local_a8 [16];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_98;
  undefined1 local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_50;
  
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&local_50,options);
  WriteCSVRel((Relation *)(local_a8 + 8),(string *)this,
              (case_insensitive_map_t<vector<Value>_> *)csv_file);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_50);
  shared_ptr<duckdb::Relation,_true>::operator->
            ((shared_ptr<duckdb::Relation,_true> *)(local_a8 + 8));
  Execute((Relation *)local_a8);
  pQVar1 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
           operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                       *)local_a8);
  if ((pQVar1->super_BaseQueryResult).success != false) {
    if ((QueryResult *)local_a8._0_8_ != (QueryResult *)0x0) {
      (*((BaseQueryResult *)local_a8._0_8_)->_vptr_BaseQueryResult[1])();
    }
    if (local_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98._M_pi);
    }
    return;
  }
  ::std::operator+(&local_70,"Failed to write \'",csv_file);
  plVar2 = (long *)::std::__cxx11::string::append((char *)&local_70);
  local_90._0_8_ = *plVar2;
  peVar3 = (element_type *)(plVar2 + 2);
  if ((element_type *)local_90._0_8_ == peVar3) {
    local_90._16_8_ = peVar3->_vptr_ClientContextWrapper;
    local_90._24_8_ = plVar2[3];
    local_90._0_8_ = (element_type *)(local_90 + 0x10);
  }
  else {
    local_90._16_8_ = peVar3->_vptr_ClientContextWrapper;
  }
  local_90._8_8_ = plVar2[1];
  *plVar2 = (long)peVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pQVar1 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
           operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                       *)local_a8);
  BaseQueryResult::ThrowError(&pQVar1->super_BaseQueryResult,(string *)local_90);
}

Assistant:

void Relation::WriteCSV(const string &csv_file, case_insensitive_map_t<vector<Value>> options) {
	auto write_csv = WriteCSVRel(csv_file, std::move(options));
	auto res = write_csv->Execute();
	if (res->HasError()) {
		const string prepended_message = "Failed to write '" + csv_file + "': ";
		res->ThrowError(prepended_message);
	}
}